

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_tapbranch2_Test::~Descriptor_Parse_Taproot_tapbranch2_Test
          (Descriptor_Parse_Taproot_tapbranch2_Test *this)

{
  Descriptor_Parse_Taproot_tapbranch2_Test *this_local;
  
  ~Descriptor_Parse_Taproot_tapbranch2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_tapbranch2) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string internal_pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string descriptor1 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,{1717a480c2e3a474eed8dba83f684731243cff8ef384521936cf3a730dd0a286,{1717a480c2e3a474eed8dba83f684731243cff8ef384521936cf3a730dd0a286,80039cda864c4f2f1c87f161b0038e57fb7a4a59ff37517048696b85cdaaf911}})";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  TapBranch tree;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;
  std::vector<std::string> child_nums = {"1"};

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
    return;
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference(&child_nums));
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_TRUE(script_ref.HasTapBranch());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript(child_nums));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(tree = script_ref.GetTapBranch());
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1pfuqf4j7ceyzmu3rsmude93ctu948r565hf2ucrn9z7zn7a7hjegskj3rsv");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 4f009acbd8c905be4470df1b92c70be16a71d354ba55cc0e6517853f77d79651");
  EXPECT_STREQ(pubkey.GetHex().c_str(), pubkey_hex.c_str());
  EXPECT_STREQ(tree.ToString().c_str(),
      "{1717a480c2e3a474eed8dba83f684731243cff8ef384521936cf3a730dd0a286,{1717a480c2e3a474eed8dba83f684731243cff8ef384521936cf3a730dd0a286,80039cda864c4f2f1c87f161b0038e57fb7a4a59ff37517048696b85cdaaf911}}");
  EXPECT_STREQ(tree.GetCurrentBranchHash().GetHex().c_str(),
      "2f36d93d14c4cbc292f7fd0f837da92fea69f4b9644acaac62c6bd305e9d63bf");
}